

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

string * tinyformat::format<double>(string *__return_storage_ptr__,char *fmt,double *args)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream aoStack_1c8 [112];
  ios_base local_158 [264];
  FormatArg *local_50;
  undefined4 local_48;
  FormatArg local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(aoStack_1c8);
  local_50 = &local_40;
  local_48 = 1;
  local_40.m_formatImpl = detail::FormatArg::formatImpl<double>;
  local_40.m_toIntImpl = detail::FormatArg::toIntImpl<double>;
  local_40.m_value = args;
  detail::formatImpl((ostream *)aoStack_1c8,fmt,local_50,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1c8);
  std::ios_base::~ios_base(local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}